

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O0

void Java_fr_limsi_wapiti_WapitiJNI_printModelPath(JNIEnv *jenv,jclass jcls,jlong jarg1)

{
  char *e;
  char *e_1;
  mdl_t *arg1;
  
  printModelPath((mdl_t *)0x11c4d0);
  return;
}

Assistant:

SWIGEXPORT void JNICALL Java_fr_limsi_wapiti_WapitiJNI_printModelPath(JNIEnv *jenv, jclass jcls, jlong jarg1) {
  mdl_t *arg1 = (mdl_t *) 0 ;
  
  (void)jenv;
  (void)jcls;
  arg1 = *(mdl_t **)&jarg1; 
  {
    try {
      printModelPath(arg1); 
    }
    catch (char *e) {
      {
        SWIG_JavaException(jenv, SWIG_RuntimeError, e); return ; 
      }; 
    }
    catch (const char *e) {
      {
        SWIG_JavaException(jenv, SWIG_RuntimeError, (char*)e); return ; 
      }; 
    }
  }
}